

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlURLInputStream.cpp
# Opt level: O0

size_t __thiscall
xercesc_4_0::CurlURLInputStream::writeCallback
          (CurlURLInputStream *this,char *buffer,size_t size,size_t nitems)

{
  ulong uVar1;
  size_t local_60;
  size_t local_58;
  XMLSize_t bufAvail;
  XMLSize_t consume;
  XMLSize_t totalConsumed;
  XMLSize_t cnt;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  CurlURLInputStream *this_local;
  
  local_60 = size * nitems;
  local_58 = local_60;
  if (this->fBytesToRead < local_60) {
    local_58 = this->fBytesToRead;
  }
  memcpy(this->fWritePtr,buffer,local_58);
  this->fWritePtr = this->fWritePtr + local_58;
  this->fBytesRead = local_58 + this->fBytesRead;
  this->fTotalBytesRead = local_58 + this->fTotalBytesRead;
  this->fBytesToRead = this->fBytesToRead - local_58;
  consume = local_58;
  local_60 = local_60 - local_58;
  if (local_60 != 0) {
    uVar1 = 0x4000 - ((long)this->fBufferHeadPtr - (long)this->fBuffer);
    if (uVar1 < local_60) {
      local_60 = uVar1;
    }
    memcpy(this->fBufferHeadPtr,buffer + local_58,local_60);
    this->fBufferHeadPtr = this->fBufferHeadPtr + local_60;
    consume = local_60 + local_58;
  }
  return consume;
}

Assistant:

size_t
CurlURLInputStream::writeCallback(char *buffer,
                                  size_t size,
                                  size_t nitems)
{
	XMLSize_t cnt = size * nitems;
	XMLSize_t totalConsumed = 0;

	// Consume as many bytes as possible immediately into the buffer
	XMLSize_t consume = (cnt > fBytesToRead) ? fBytesToRead : cnt;
	memcpy(fWritePtr, buffer, consume);
	fWritePtr		+= consume;
	fBytesRead		+= consume;
	fTotalBytesRead	+= consume;
	fBytesToRead	-= consume;

	//printf("write callback consuming %d bytes\n", consume);

	// If bytes remain, rebuffer as many as possible into our holding buffer
	buffer			+= consume;
	totalConsumed	+= consume;
	cnt				-= consume;
	if (cnt > 0)
	{
		XMLSize_t bufAvail = sizeof(fBuffer) - (fBufferHeadPtr - fBuffer);
		consume = (cnt > bufAvail) ? bufAvail : cnt;
		memcpy(fBufferHeadPtr, buffer, consume);
		fBufferHeadPtr	+= consume;
		buffer			+= consume;
		totalConsumed	+= consume;
		//printf("write callback rebuffering %d bytes\n", consume);
	}

	// Return the total amount we've consumed. If we don't consume all the bytes
	// then an error will be generated. Since our buffer size is equal to the
	// maximum size that curl will write, this should never happen unless there
	// is a logic error somewhere here.
	return totalConsumed;
}